

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O3

void __thiscall stackjit::ByteCodeParser::nextTokenAtEnd(ByteCodeParser *this)

{
  string local_28;
  
  if (this->mTokenIndex ==
      ((long)(this->mTokens).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->mTokens).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    this->mTokenIndex = this->mTokenIndex + 1;
    return;
  }
  nextToken_abi_cxx11_(&local_28,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ByteCodeParser::nextTokenAtEnd() {
		if (mTokenIndex != mTokens.size() - 1) {
			nextToken();
		} else {
			mTokenIndex++;
		}
	}